

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemDependenceGraph.cpp
# Opt level: O3

DependenceGraph * __thiscall dg::llvmdg::SDGBuilder::getOrCreateDG(SDGBuilder *this,Function *F)

{
  SystemDependenceGraph *pSVar1;
  SystemDependenceGraph *pSVar2;
  long lVar3;
  DependenceGraph *pDVar4;
  mapped_type *ppDVar5;
  SystemDependenceGraph *pSVar6;
  undefined1 auVar7 [16];
  Function *local_40;
  undefined8 local_38;
  Function local_30;
  undefined7 uStack_2f;
  
  pSVar1 = this->_llvmsdg;
  pSVar6 = *(SystemDependenceGraph **)(pSVar1 + 0x100);
  if (pSVar6 != (SystemDependenceGraph *)0x0) {
    pSVar2 = pSVar1 + 0xf8;
    do {
      if (*(Function **)(pSVar6 + 0x20) >= F) {
        pSVar2 = pSVar6;
      }
      pSVar6 = *(SystemDependenceGraph **)
                (pSVar6 + (ulong)(*(Function **)(pSVar6 + 0x20) < F) * 8 + 0x10);
    } while (pSVar6 != (SystemDependenceGraph *)0x0);
    if (((pSVar2 != pSVar1 + 0xf8) && (*(Function **)(pSVar2 + 0x20) <= F)) &&
       (*(DependenceGraph **)(pSVar2 + 0x28) != (DependenceGraph *)0x0)) {
      return *(DependenceGraph **)(pSVar2 + 0x28);
    }
  }
  auVar7 = llvm::Value::getName();
  lVar3 = auVar7._0_8_;
  if (lVar3 == 0) {
    local_40 = &local_30;
    local_38 = 0;
    local_30 = (Function)0x0;
  }
  else {
    local_40 = &local_30;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,lVar3,auVar7._8_8_ + lVar3);
  }
  pDVar4 = sdg::SystemDependenceGraph::createGraph((SystemDependenceGraph *)(pSVar1 + 0x28));
  std::__cxx11::string::_M_assign((string *)&pDVar4->_name);
  if (local_40 != &local_30) {
    operator_delete(local_40,CONCAT71(uStack_2f,local_30) + 1);
  }
  local_40 = F;
  ppDVar5 = std::
            map<const_llvm::Function_*,_dg::sdg::DependenceGraph_*,_std::less<const_llvm::Function_*>,_std::allocator<std::pair<const_llvm::Function_*const,_dg::sdg::DependenceGraph_*>_>_>
            ::operator[]((map<const_llvm::Function_*,_dg::sdg::DependenceGraph_*,_std::less<const_llvm::Function_*>,_std::allocator<std::pair<const_llvm::Function_*const,_dg::sdg::DependenceGraph_*>_>_>
                          *)(this->_llvmsdg + 0xf0),&local_40);
  *ppDVar5 = pDVar4;
  return pDVar4;
}

Assistant:

sdg::DependenceGraph &getOrCreateDG(llvm::Function *F) {
        auto *dg = _llvmsdg->getDG(F);
        if (!dg) {
            auto &g = _llvmsdg->getSDG().createGraph(F->getName().str());
            _llvmsdg->addFunMapping(F, &g);
            return g;
        }

        return *dg;
    }